

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

Fad<float> * __thiscall
TPZMatrix<Fad<float>_>::MatrixNorm
          (Fad<float> *__return_storage_ptr__,TPZMatrix<Fad<float>_> *this,int p,int64_t numiter,
          REAL tol)

{
  long lVar1;
  Fad<float> *pFVar2;
  undefined4 uVar3;
  long lVar4;
  Fad<float> *pFVar5;
  Fad<float> *pFVar6;
  bool bVar7;
  ostream *poVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  Fad<float> sum;
  TPZVec<Fad<float>_> EigenVal;
  TPZVec<Fad<float>_> ROW;
  TPZFMatrix<Fad<float>_> transp;
  undefined1 local_168 [8];
  undefined1 local_160 [16];
  float local_150;
  undefined4 uStack_14c;
  float local_148 [2];
  long local_140;
  REAL local_138;
  int64_t local_130;
  Fad<float> *local_128;
  TPZVec<Fad<float>_> local_120;
  TPZVec<Fad<float>_> local_100;
  Fad<float> local_e0;
  TPZFMatrix<Fad<float>_> local_c0;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  if (lVar1 != 0) {
    local_138 = tol;
    local_130 = numiter;
    if (lVar1 != (this->super_TPZBaseMatrix).fCol) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                 ,0x51);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar8 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," - Cols() = ",0xc);
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    if (p == 2) {
      local_128 = __return_storage_ptr__;
      TPZFMatrix<Fad<float>_>::TPZFMatrix(&local_c0,lVar1,lVar1);
      if (0 < lVar1) {
        lVar13 = 0;
        do {
          lVar15 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      ((Fad<float> *)local_168,this,lVar15,lVar13);
            pFVar5 = local_c0.fElem;
            if ((local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow <= lVar13) ||
               (local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol <= lVar15)) {
              TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow * lVar15;
            local_c0.fElem[lVar10 + lVar13].val_ = (float)local_168._0_4_;
            Vector<float>::operator=
                      (&local_c0.fElem[lVar10 + lVar13].dx_,(Vector<float> *)local_160);
            pFVar5[lVar10 + lVar13].defaultVal = local_150;
            Fad<float>::~Fad((Fad<float> *)local_168);
            lVar15 = lVar15 + 1;
          } while (lVar1 != lVar15);
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar1);
      }
      TPZVec<Fad<float>_>::TPZVec(&local_100,lVar1);
      if (0 < lVar1) {
        lVar13 = 0;
        do {
          lVar15 = 0;
          lVar10 = 0;
          local_140 = lVar13;
          do {
            pFVar6 = local_c0.fElem;
            pFVar5 = local_100.fStore;
            if ((local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow <= local_140) ||
               (local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol <= lVar10)) {
              TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar12 = local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow * lVar10;
            pfVar9 = (float *)((long)&(local_100.fStore)->val_ + lVar15);
            *pfVar9 = local_c0.fElem[lVar12 + lVar13].val_;
            Vector<float>::operator=
                      ((Vector<float> *)(pfVar9 + 2),&local_c0.fElem[lVar12 + lVar13].dx_);
            *(float *)((long)&pFVar5->defaultVal + lVar15) = pFVar6[lVar12 + lVar13].defaultVal;
            lVar10 = lVar10 + 1;
            lVar15 = lVar15 + 0x20;
          } while (lVar1 != lVar10);
          lVar15 = 0;
          do {
            local_168._0_4_ = 0.0;
            local_160._0_4_ = 0.0;
            local_160._8_8_ = (float *)0x0;
            local_150 = 0.0;
            lVar10 = 0;
            lVar12 = 0;
            do {
              pFVar5 = local_100.fStore;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                        (&local_e0,this,lVar12,lVar15);
              local_120._vptr_TPZVec = (_func_int **)((long)&pFVar5->val_ + lVar10);
              local_120.fStore = &local_e0;
              Fad<float>::operator+=
                        ((Fad<float> *)local_168,
                         (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)&local_120);
              Fad<float>::~Fad(&local_e0);
              pFVar5 = local_c0.fElem;
              lVar4 = local_140;
              lVar12 = lVar12 + 1;
              lVar10 = lVar10 + 0x20;
            } while (lVar1 != lVar12);
            if ((local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow <= local_140) ||
               (local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol <= lVar15)) {
              TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow * lVar15;
            local_c0.fElem[lVar10 + lVar13].val_ = (float)local_168._0_4_;
            Vector<float>::operator=
                      (&local_c0.fElem[lVar10 + lVar13].dx_,(Vector<float> *)local_160);
            pFVar5[lVar10 + lVar13].defaultVal = local_150;
            Fad<float>::~Fad((Fad<float> *)local_168);
            lVar15 = lVar15 + 1;
          } while (lVar15 != lVar1);
          lVar13 = lVar4 + 1;
        } while (lVar13 != lVar1);
      }
      local_120._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018465f0;
      local_120.fStore = (Fad<float> *)0x0;
      local_120.fNElements = 0;
      local_120.fNAlloc = 0;
      bVar7 = SolveEigenvaluesJacobi
                        (&local_c0.super_TPZMatrix<Fad<float>_>,&local_130,&local_138,&local_120);
      if (!bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]"
                   ,0x51);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," - it was not possible to find Eigenvalues. Iterations = "
                   ,0x39);
        poVar8 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," - error found = ",0x11);
        poVar8 = std::ostream::_M_insert<double>(local_138);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      FadFuncSqrt<Fad<float>_>::FadFuncSqrt((FadFuncSqrt<Fad<float>_> *)&local_e0,local_120.fStore);
      pFVar5 = local_128;
      FadExpr<FadFuncSqrt<Fad<float>_>_>::FadExpr
                ((FadExpr<FadFuncSqrt<Fad<float>_>_> *)local_168,
                 (FadFuncSqrt<Fad<float>_> *)&local_e0);
      Fad<float>::~Fad(&local_e0);
      if ((float)local_160._0_4_ < 0.0) {
        fVar16 = sqrtf((float)local_160._0_4_);
      }
      else {
        fVar16 = SQRT((float)local_160._0_4_);
      }
      pFVar5->val_ = fVar16;
      uVar3 = local_160._8_4_;
      (pFVar5->dx_).num_elts = 0;
      (pFVar5->dx_).ptr_to_data = (float *)0x0;
      if ((long)(int)local_160._8_4_ < 1) {
        pFVar5->defaultVal = 0.0;
      }
      else {
        (pFVar5->dx_).num_elts = local_160._8_4_;
        uVar11 = (long)(int)local_160._8_4_ << 2;
        pfVar9 = (float *)operator_new__(uVar11);
        (pFVar5->dx_).ptr_to_data = pfVar9;
        pFVar5->defaultVal = 0.0;
        if (0 < (int)uVar3) {
          uVar14 = 0;
          do {
            pfVar9 = (float *)(CONCAT44(uStack_14c,local_150) + uVar14);
            if (local_160._8_4_ == 0) {
              pfVar9 = local_148;
            }
            fVar16 = *pfVar9;
            if ((float)local_160._0_4_ < 0.0) {
              fVar17 = sqrtf((float)local_160._0_4_);
            }
            else {
              fVar17 = SQRT((float)local_160._0_4_);
            }
            *(float *)((long)(pFVar5->dx_).ptr_to_data + uVar14) = fVar16 / (fVar17 + fVar17);
            uVar14 = uVar14 + 4;
          } while (uVar11 != uVar14);
        }
      }
      Fad<float>::~Fad((Fad<float> *)local_160);
      pFVar6 = local_120.fStore;
      local_120._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018465f0;
      if (local_120.fStore != (Fad<float> *)0x0) {
        pFVar2 = local_120.fStore + -1;
        lVar1 = *(long *)&local_120.fStore[-1].defaultVal;
        if (lVar1 != 0) {
          lVar13 = lVar1 << 5;
          do {
            Fad<float>::~Fad((Fad<float> *)((long)&pFVar6[-1].val_ + lVar13));
            lVar13 = lVar13 + -0x20;
          } while (lVar13 != 0);
        }
        operator_delete__(&pFVar2->defaultVal,lVar1 << 5 | 8);
      }
      local_100._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018465f0;
      if (local_100.fStore != (Fad<float> *)0x0) {
        lVar1 = *(long *)&local_100.fStore[-1].defaultVal;
        if (lVar1 != 0) {
          lVar13 = lVar1 << 5;
          do {
            Fad<float>::~Fad((Fad<float> *)((long)&local_100.fStore[-1].val_ + lVar13));
            lVar13 = lVar13 + -0x20;
          } while (lVar13 != 0);
        }
        operator_delete__(&local_100.fStore[-1].defaultVal,lVar1 << 5 | 8);
      }
      TPZFMatrix<Fad<float>_>::~TPZFMatrix(&local_c0);
      return pFVar5;
    }
    if (p == 1) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      if (lVar1 < 1) {
        return __return_storage_ptr__;
      }
      lVar13 = 0;
      do {
        fVar16 = 0.0;
        lVar15 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    ((Fad<float> *)&local_c0,this,lVar15,lVar13);
          fVar16 = fVar16 + ABS(local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
                                super_TPZSavable._vptr_TPZSavable._0_4_);
          Fad<float>::~Fad((Fad<float> *)&local_c0);
          lVar15 = lVar15 + 1;
        } while (lVar1 != lVar15);
        if ((ABS(__return_storage_ptr__->val_) < fVar16) &&
           (__return_storage_ptr__->val_ = fVar16, (__return_storage_ptr__->dx_).num_elts != 0)) {
          local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable._0_4_ = 0.0;
          Vector<float>::operator=(&__return_storage_ptr__->dx_,(float *)&local_c0);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar1);
      return __return_storage_ptr__;
    }
    if (p == 0) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      if (lVar1 < 1) {
        return __return_storage_ptr__;
      }
      lVar13 = 0;
      do {
        fVar16 = 0.0;
        lVar15 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    ((Fad<float> *)&local_c0,this,lVar13,lVar15);
          fVar16 = fVar16 + ABS(local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
                                super_TPZSavable._vptr_TPZSavable._0_4_);
          Fad<float>::~Fad((Fad<float> *)&local_c0);
          lVar15 = lVar15 + 1;
        } while (lVar1 != lVar15);
        if ((ABS(__return_storage_ptr__->val_) < fVar16) &&
           (__return_storage_ptr__->val_ = fVar16, (__return_storage_ptr__->dx_).num_elts != 0)) {
          local_c0.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable._0_4_ = 0.0;
          Vector<float>::operator=(&__return_storage_ptr__->dx_,(float *)&local_c0);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar1);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<Fad<float>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<float>]",
               0x51);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," p = ",5);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," is not a correct option",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  __return_storage_ptr__->val_ = 0.0;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
  __return_storage_ptr__->defaultVal = 0.0;
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}